

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extensions(InstanceBuilder *this,size_t count,char **extensions)

{
  pointer *pppcVar1;
  iterator __position;
  
  if (count != 0 && extensions != (char **)0x0) {
    do {
      __position._M_current =
           (this->info).extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->info).extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&(this->info).extensions,
                   __position,extensions);
      }
      else {
        *__position._M_current = *extensions;
        pppcVar1 = &(this->info).extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      extensions = extensions + 1;
      count = count - 1;
    } while (count != 0);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extensions(size_t count, const char* const* extensions) {
    if (!extensions || count == 0) return *this;
    for (size_t i = 0; i < count; i++) {
        info.extensions.push_back(extensions[i]);
    }
    return *this;
}